

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.h
# Opt level: O3

char * __thiscall
btGeneric6DofSpringConstraint::serialize
          (btGeneric6DofSpringConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  int i_2;
  btTransform *pbVar1;
  long lVar2;
  long lVar3;
  btGeneric6DofConstraintData *dof;
  long lVar4;
  
  btTypedConstraint::serialize((btTypedConstraint *)this,dataBuffer,serializer);
  pbVar1 = &(this->super_btGeneric6DofConstraint).m_frameInA;
  lVar2 = (long)dataBuffer + 0x40;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(btScalar *)(lVar2 + lVar4 * 4) = (pbVar1->m_basis).m_el[0].m_floats[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x10;
    pbVar1 = (btTransform *)((pbVar1->m_basis).m_el + 1);
  } while (lVar3 != 3);
  lVar2 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar2 * 4 + 0x70) =
         (this->super_btGeneric6DofConstraint).m_frameInA.m_origin.m_floats[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pbVar1 = &(this->super_btGeneric6DofConstraint).m_frameInB;
  lVar2 = (long)dataBuffer + 0x80;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(btScalar *)(lVar2 + lVar4 * 4) = (pbVar1->m_basis).m_el[0].m_floats[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x10;
    pbVar1 = (btTransform *)((pbVar1->m_basis).m_el + 1);
  } while (lVar3 != 3);
  lVar2 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar2 * 4 + 0xb0) =
         (this->super_btGeneric6DofConstraint).m_frameInB.m_origin.m_floats[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  lVar2 = -0xc0;
  lVar3 = 0;
  do {
    *(undefined4 *)((long)dataBuffer + lVar3 + 0xf0) =
         *(undefined4 *)
          ((long)(this->super_btGeneric6DofConstraint).m_calculatedTransformA.m_basis.m_el[0].
                 m_floats + lVar2 + -4);
    *(undefined4 *)((long)dataBuffer + lVar3 + 0xe0) =
         *(undefined4 *)
          ((long)(this->super_btGeneric6DofConstraint).m_calculatedTransformA.m_basis.m_el[0].
                 m_floats + lVar2);
    *(undefined4 *)((long)dataBuffer + lVar3 + 0xd0) =
         *(undefined4 *)
          ((long)(this->super_btGeneric6DofConstraint).m_linearLimits.m_lowerLimit.m_floats + lVar3)
    ;
    *(undefined4 *)((long)dataBuffer + lVar3 + 0xc0) =
         *(undefined4 *)
          ((long)(this->super_btGeneric6DofConstraint).m_linearLimits.m_upperLimit.m_floats + lVar3)
    ;
    lVar3 = lVar3 + 4;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0);
  *(uint *)((long)dataBuffer + 0x100) =
       (uint)(this->super_btGeneric6DofConstraint).m_useLinearReferenceFrameA;
  *(uint *)((long)dataBuffer + 0x104) =
       (uint)(this->super_btGeneric6DofConstraint).m_useOffsetForConstraintFrame;
  lVar2 = -6;
  do {
    *(btScalar *)((long)dataBuffer + lVar2 * 4 + 0x138) = this->m_springStiffness[lVar2];
    *(btScalar *)((long)dataBuffer + lVar2 * 4 + 0x168) = this->m_springDamping[lVar2 + 6];
    *(uint *)((long)dataBuffer + lVar2 * 4 + 0x120) =
         (uint)*(byte *)((long)this->m_equilibriumPoint + lVar2 + -1);
    *(btScalar *)((long)dataBuffer + lVar2 * 4 + 0x150) = this->m_springDamping[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return "btGeneric6DofSpringConstraintData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btGeneric6DofSpringConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btGeneric6DofSpringConstraintData2* dof = (btGeneric6DofSpringConstraintData2*)dataBuffer;
	btGeneric6DofConstraint::serialize(&dof->m_6dofData,serializer);

	int i;
	for (i=0;i<6;i++)
	{
		dof->m_equilibriumPoint[i] = m_equilibriumPoint[i];
		dof->m_springDamping[i] = m_springDamping[i];
		dof->m_springEnabled[i] = m_springEnabled[i]? 1 : 0;
		dof->m_springStiffness[i] = m_springStiffness[i];
	}
	return btGeneric6DofSpringConstraintDataName;
}